

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall
cmMakefile::DeferScope::DeferScope(DeferScope *this,cmMakefile *mf,string *deferredInFile)

{
  cmMakefile *pcVar1;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_100;
  undefined1 local_f0 [32];
  _Alloc_hider local_d0;
  size_type local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  long local_b0;
  bool local_88;
  cmListFileContext local_80;
  
  this->Makefile = mf;
  local_f0._0_8_ = local_f0 + 0x10;
  local_f0._8_8_ = 0;
  local_f0[0x10] = '\0';
  local_d0._M_p = (pointer)&local_c0;
  local_c8 = 0;
  local_c0._M_local_buf[0] = '\0';
  local_88 = false;
  local_b0 = -1;
  std::__cxx11::string::_M_assign((string *)&local_d0);
  pcVar1 = this->Makefile;
  cmListFileContext::cmListFileContext(&local_80,(cmListFileContext *)local_f0);
  cmConstStack<cmListFileContext,_cmListFileBacktrace>::Push
            ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)&local_100,
             (cmListFileContext *)&pcVar1->Backtrace);
  std::
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ::operator=((__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               *)&this->Makefile->Backtrace,&local_100);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_100._M_refcount);
  cmListFileContext::~cmListFileContext(&local_80);
  this->Makefile->DeferRunning = true;
  cmListFileContext::~cmListFileContext((cmListFileContext *)local_f0);
  return;
}

Assistant:

DeferScope(cmMakefile* mf, std::string const& deferredInFile)
    : Makefile(mf)
  {
    cmListFileContext lfc;
    lfc.Line = cmListFileContext::DeferPlaceholderLine;
    lfc.FilePath = deferredInFile;
    this->Makefile->Backtrace = this->Makefile->Backtrace.Push(lfc);
    this->Makefile->DeferRunning = true;
  }